

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

uint32_t getTagNumber(char *tagname)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((gMainTable.tagList != (uint16_t *)0x0) && (bVar4 = gMainTable.tagListSize != 0, bVar4)) {
    iVar1 = uprv_stricmp_63((char *)((ulong)((uint)*gMainTable.tagList * 2) +
                                    (long)gMainTable.stringTable),tagname);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      uVar3 = 1;
      do {
        bVar4 = uVar3 < gMainTable.tagListSize;
        if (!bVar4) {
          return 0xffffffff;
        }
        iVar1 = uprv_stricmp_63((char *)((ulong)((uint)gMainTable.tagList[uVar3] * 2) +
                                        (long)gMainTable.stringTable),tagname);
        uVar3 = uVar3 + 1;
      } while (iVar1 != 0);
      uVar2 = (int)uVar3 - 1;
    }
    if (bVar4) {
      return uVar2;
    }
  }
  return 0xffffffff;
}

Assistant:

static uint32_t getTagNumber(const char *tagname) {
    if (gMainTable.tagList) {
        uint32_t tagNum;
        for (tagNum = 0; tagNum < gMainTable.tagListSize; tagNum++) {
            if (!uprv_stricmp(GET_STRING(gMainTable.tagList[tagNum]), tagname)) {
                return tagNum;
            }
        }
    }

    return UINT32_MAX;
}